

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

void __thiscall
proto3_arena_unittest::TestAllTypes::set_allocated_oneof_nested_message
          (TestAllTypes *this,TestAllTypes_NestedMessage *oneof_nested_message)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TestAllTypes_NestedMessage *oneof_nested_message_local;
  TestAllTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (oneof_nested_message != (TestAllTypes_NestedMessage *)0x0) {
    submessage_arena_00 =
         google::protobuf::MessageLite::GetArena((MessageLite *)oneof_nested_message);
    message_arena = (Arena *)oneof_nested_message;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<proto3_arena_unittest::TestAllTypes_NestedMessage>
                              (message_arena_00,oneof_nested_message,submessage_arena_00);
    }
    set_has_oneof_nested_message(this);
    (this->field_0)._impl_.oneof_field_.oneof_nested_message_ =
         (TestAllTypes_NestedMessage *)message_arena;
  }
  return;
}

Assistant:

void TestAllTypes::set_allocated_oneof_nested_message(::proto3_arena_unittest::TestAllTypes_NestedMessage* PROTOBUF_NULLABLE oneof_nested_message) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (oneof_nested_message) {
    ::google::protobuf::Arena* submessage_arena = oneof_nested_message->GetArena();
    if (message_arena != submessage_arena) {
      oneof_nested_message = ::google::protobuf::internal::GetOwnedMessage(message_arena, oneof_nested_message, submessage_arena);
    }
    set_has_oneof_nested_message();
    _impl_.oneof_field_.oneof_nested_message_ = oneof_nested_message;
  }
  // @@protoc_insertion_point(field_set_allocated:proto3_arena_unittest.TestAllTypes.oneof_nested_message)
}